

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLMaterialRenderer.h
# Opt level: O0

void __thiscall
irr::video::COpenGLMaterialRenderer_SOLID::OnSetMaterial
          (COpenGLMaterialRenderer_SOLID *this,SMaterial *material,SMaterial *lastMaterial,
          bool resetAllRenderstates,IMaterialRendererServices *services)

{
  byte bVar1;
  E_OPENGL_FIXED_PIPELINE_STATE EVar2;
  byte in_CL;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar1 = in_CL & 1;
  EVar2 = COpenGLDriver::getFixedPipelineState(*(COpenGLDriver **)(in_RDI + 8));
  if (EVar2 == EOFPS_DISABLE) {
    COpenGLDriver::setFixedPipelineState(*(COpenGLDriver **)(in_RDI + 8),EOFPS_DISABLE_TO_ENABLE);
  }
  else {
    COpenGLDriver::setFixedPipelineState(*(COpenGLDriver **)(in_RDI + 8),EOFPS_ENABLE);
  }
  COpenGLDriver::disableTextures
            ((COpenGLDriver *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),(u32)((ulong)in_R8 >> 0x20))
  ;
  (**(code **)(**(long **)(in_RDI + 8) + 0x3c0))(*(long **)(in_RDI + 8),in_RSI,in_RDX,bVar1 & 1);
  return;
}

Assistant:

virtual void OnSetMaterial(const SMaterial &material, const SMaterial &lastMaterial,
			bool resetAllRenderstates, IMaterialRendererServices *services) override
	{
		if (Driver->getFixedPipelineState() == COpenGLDriver::EOFPS_DISABLE)
			Driver->setFixedPipelineState(COpenGLDriver::EOFPS_DISABLE_TO_ENABLE);
		else
			Driver->setFixedPipelineState(COpenGLDriver::EOFPS_ENABLE);

		Driver->disableTextures(1);
		Driver->setBasicRenderStates(material, lastMaterial, resetAllRenderstates);
	}